

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall libcellml::Importer::Importer(Importer *this)

{
  pointer *ppuVar1;
  LoggerImpl *pLVar2;
  
  pLVar2 = (LoggerImpl *)operator_new(0xb0);
  ppuVar1 = &pLVar2[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  memset(pLVar2,0,0xb0);
  pLVar2[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ppuVar1;
  pLVar2[1].mWarnings.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)ppuVar1;
  pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar2[1].mMessages.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar2[1].mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Logger::Logger(&this->super_Logger,pLVar2);
  Strict::Strict(&this->super_Strict);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Importer_002f5dc8;
  (this->super_Strict)._vptr_Strict = (_func_int **)&PTR__Importer_002f5de8;
  pLVar2 = Logger::pFunc(&this->super_Logger);
  pLVar2[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  Strict::setStrict(&this->super_Strict,true);
  return;
}

Assistant:

Importer::Importer()
    : Logger(new Importer::ImporterImpl())
{
    pFunc()->mImporter = this;
    setStrict(true);
}